

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCount(BtCursor *pCur,i64 *pnEntry)

{
  ushort uVar1;
  int iVar2;
  MemPage *pMVar3;
  byte *pbVar4;
  long lVar5;
  short sVar6;
  i64 iVar7;
  
  iVar7 = 0;
  if (pCur->pgnoRoot == 0) {
LAB_0013ea40:
    *pnEntry = iVar7;
    iVar2 = 0;
  }
  else {
    iVar2 = moveToRoot(pCur);
    if (iVar2 == 0) {
      iVar7 = 0;
      do {
        sVar6 = pCur->iPage;
        lVar5 = (long)sVar6;
        pMVar3 = pCur->apPage[lVar5];
        if (pMVar3->leaf == '\0') {
          if (pMVar3->intKey == '\0') {
            iVar7 = iVar7 + (ulong)pMVar3->nCell;
          }
        }
        else {
          iVar7 = iVar7 + (ulong)pMVar3->nCell;
          do {
            if (sVar6 == 0) goto LAB_0013ea40;
            moveToParent(pCur);
            sVar6 = pCur->iPage;
          } while (pCur->apPage[sVar6]->nCell <= pCur->aiIdx[sVar6]);
          pCur->aiIdx[sVar6] = pCur->aiIdx[sVar6] + 1;
          lVar5 = (long)pCur->iPage;
          pMVar3 = pCur->apPage[lVar5];
        }
        uVar1 = pCur->aiIdx[lVar5];
        if (uVar1 == pMVar3->nCell) {
          pbVar4 = pMVar3->aData + (ulong)pMVar3->hdrOffset + 0xb;
        }
        else {
          pbVar4 = pMVar3->aData +
                   (ulong)(CONCAT11(pMVar3->aCellIdx[(ulong)uVar1 * 2],
                                    pMVar3->aCellIdx[(ulong)uVar1 * 2 + 1]) & pMVar3->maskPage) + 3;
        }
        iVar2 = moveToChild(pCur,(uint)*pbVar4 |
                                 (uint)pbVar4[-1] << 8 |
                                 (uint)pbVar4[-2] << 0x10 | (uint)pbVar4[-3] << 0x18);
      } while (iVar2 == 0);
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCount(BtCursor *pCur, i64 *pnEntry){
  i64 nEntry = 0;                      /* Value to return in *pnEntry */
  int rc;                              /* Return code */

  if( pCur->pgnoRoot==0 ){
    *pnEntry = 0;
    return SQLITE_OK;
  }
  rc = moveToRoot(pCur);

  /* Unless an error occurs, the following loop runs one iteration for each
  ** page in the B-Tree structure (not including overflow pages). 
  */
  while( rc==SQLITE_OK ){
    int iIdx;                          /* Index of child node in parent */
    MemPage *pPage;                    /* Current page of the b-tree */

    /* If this is a leaf page or the tree is not an int-key tree, then 
    ** this page contains countable entries. Increment the entry counter
    ** accordingly.
    */
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->leaf || !pPage->intKey ){
      nEntry += pPage->nCell;
    }

    /* pPage is a leaf node. This loop navigates the cursor so that it 
    ** points to the first interior cell that it points to the parent of
    ** the next page in the tree that has not yet been visited. The
    ** pCur->aiIdx[pCur->iPage] value is set to the index of the parent cell
    ** of the page, or to the number of cells in the page if the next page
    ** to visit is the right-child of its parent.
    **
    ** If all pages in the tree have been visited, return SQLITE_OK to the
    ** caller.
    */
    if( pPage->leaf ){
      do {
        if( pCur->iPage==0 ){
          /* All pages of the b-tree have been visited. Return successfully. */
          *pnEntry = nEntry;
          return SQLITE_OK;
        }
        moveToParent(pCur);
      }while ( pCur->aiIdx[pCur->iPage]>=pCur->apPage[pCur->iPage]->nCell );

      pCur->aiIdx[pCur->iPage]++;
      pPage = pCur->apPage[pCur->iPage];
    }

    /* Descend to the child node of the cell that the cursor currently 
    ** points at. This is the right-child if (iIdx==pPage->nCell).
    */
    iIdx = pCur->aiIdx[pCur->iPage];
    if( iIdx==pPage->nCell ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
    }else{
      rc = moveToChild(pCur, get4byte(findCell(pPage, iIdx)));
    }
  }

  /* An error has occurred. Return an error code. */
  return rc;
}